

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

bool pstore::command_line::details::
     parse_positional_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                first_arg,
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               last_arg)

{
  option *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  _List_node_base *p_Var4;
  _List_const_iterator<pstore::command_line::option_*> _Var5;
  byte bVar6;
  
  p_Var4 = (_List_node_base *)option::all_abi_cxx11_();
  _Var5 = std::
          __find_if<std::_List_const_iterator<pstore::command_line::option*>,__gnu_cxx::__ops::_Iter_pred<pstore::command_line::details::parse_positional_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(pstore::command_line::option_const*)_1_>>
                    ((((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                        *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,p_Var4);
  bVar6 = 1;
  while ((first_arg._M_current != last_arg._M_current && (_Var5._M_node != p_Var4))) {
    this = (option *)_Var5._M_node[1]._M_next;
    iVar2 = (*this->_vptr_option[9])(this);
    if ((char)iVar2 == '\0') {
      assert_failed("handler->is_positional ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                    ,300);
    }
    iVar2 = (*this->_vptr_option[0x10])(this);
    iVar3 = (*this->_vptr_option[0xf])(this,first_arg._M_current);
    bVar1 = option::can_accept_another_occurrence(this);
    if (!bVar1) {
      _Var5 = std::
              __find_if<std::_List_const_iterator<pstore::command_line::option*>,__gnu_cxx::__ops::_Iter_pred<pstore::command_line::details::parse_positional_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(pstore::command_line::option_const*)_1_>>
                        ((((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                            *)&(_Var5._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base.
                         _M_next,p_Var4);
    }
    bVar6 = (byte)iVar2 & (byte)iVar3;
    first_arg._M_current = first_arg._M_current + 1;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool parse_positional_arguments (InputIterator first_arg, InputIterator last_arg) {
                bool ok = true;

                auto const & all_options = option::all ();
                auto const is_positional = [] (option const * const opt) {
                    return opt->is_positional ();
                };

                auto end = std::end (all_options);
                auto it = std::find_if (std::begin (all_options), end, is_positional);
                for (; first_arg != last_arg && it != end; ++first_arg) {
                    option * const handler = *it;
                    PSTORE_ASSERT (handler->is_positional ());
                    ok = handler->add_occurrence ();
                    if (!handler->value (*first_arg)) {
                        ok = false;
                    }
                    if (!handler->can_accept_another_occurrence ()) {
                        it = std::find_if (++it, end, is_positional);
                    }
                }
                return ok;
            }